

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O3

TermList __thiscall Parse::SMTLIB2::ParseResult::asTerm(ParseResult *this,TermList *resTrm)

{
  Term *pTVar1;
  TermList TVar2;
  
  if (this->formula == true) {
    pTVar1 = Kernel::Term::createFormula((this->field_3).frm);
    resTrm->_content = (uint64_t)pTVar1;
    TVar2 = Kernel::AtomicSort::boolSort();
    return (TermList)TVar2._content;
  }
  resTrm->_content = (uint64_t)this->field_3;
  return (TermList)(this->sort)._content;
}

Assistant:

TermList SMTLIB2::ParseResult::asTerm(TermList& resTrm)
{
  if (formula) {
    ASS_EQ(sort, AtomicSort::boolSort());

    LOG2("asTerm wrap ",frm->toString());

    resTrm = TermList(Term::createFormula(frm));

    LOG2("asTerm sort ",sort);
    return AtomicSort::boolSort();
  } else {
    resTrm = trm;

    LOG2("asTerm native ",trm.toString());

    LOG2("asTerm sort ",sort);

    return sort;
  }
}